

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDG2Dot.h
# Opt level: O0

void __thiscall dg::llvmdg::SDG2Dot::dump(SDG2Dot *this,string *file)

{
  bool bVar1;
  DGElementType DVar2;
  uint uVar3;
  reference ppDVar4;
  DGBBlock *this_00;
  reference ppDVar5;
  reference ppDVar6;
  reference ppDVar7;
  ostream *poVar8;
  string *psVar9;
  undefined8 in_RSI;
  ostream *in_RDI;
  pair<std::_Rb_tree_const_iterator<dg::sdg::DGNode_*>,_bool> pVar10;
  pair<std::_Rb_tree_const_iterator<dg::sdg::DGNodeCall_*>,_bool> pVar11;
  DependenceGraph *dg_1;
  iterator __end3_3;
  iterator __begin3_3;
  CalleesTy *__range3_3;
  DGNodeCall *C_1;
  iterator __end2_1;
  iterator __begin2_1;
  set<dg::sdg::DGNodeCall_*,_std::less<dg::sdg::DGNodeCall_*>,_std::allocator<dg::sdg::DGNodeCall_*>_>
  *__range2_1;
  DGBBlock *ctrlB;
  DepDGElement *ctrl;
  edge_iterator __end4_1;
  edge_iterator __begin4_1;
  edges_range *__range4_1;
  DGBBlock *blk_1;
  bblocks_iterator __end3_2;
  bblocks_iterator __begin3_2;
  bblocks_range *__range3_2;
  DGNode *nd_1;
  nodes_iterator __end3_1;
  nodes_iterator __begin3_1;
  nodes_range *__range3_1;
  DGNodeCall *C;
  DGNode *nd;
  iterator __end4;
  iterator __begin4;
  NodesTy *__range4;
  DGBBlock *blk;
  bblocks_iterator __end3;
  bblocks_iterator __begin3;
  bblocks_range *__range3;
  DependenceGraph *dg;
  graphs_iterator __end2;
  graphs_iterator __begin2;
  SystemDependenceGraph *__range2;
  set<dg::sdg::DGNodeCall_*,_std::less<dg::sdg::DGNodeCall_*>,_std::allocator<dg::sdg::DGNodeCall_*>_>
  calls;
  ofstream out;
  SystemDependenceGraph *in_stack_fffffffffffffb98;
  ostream *in_stack_fffffffffffffba0;
  ostream *in_stack_fffffffffffffba8;
  ostream *in_stack_fffffffffffffbb0;
  ostream *in_stack_fffffffffffffbb8;
  ostream *in_stack_fffffffffffffbc0;
  ostream *in_stack_fffffffffffffbc8;
  ostream *in_stack_fffffffffffffbd0;
  DGParameters *in_stack_fffffffffffffbd8;
  SDG2Dot *in_stack_fffffffffffffbe0;
  ostream *in_stack_fffffffffffffc00;
  ostream *in_stack_fffffffffffffc08;
  SDG2Dot *in_stack_fffffffffffffc10;
  SDG2Dot *in_stack_fffffffffffffc20;
  DependenceGraph *this_01;
  _Self local_3d8;
  _Self local_3d0;
  CalleesTy *local_3c8;
  DGNodeCall *local_3c0;
  _Self local_3b8;
  _Self local_3b0;
  undefined1 *local_3a8;
  DGBBlock *local_3a0;
  DepDGElement *in_stack_fffffffffffffc68;
  edge_iterator in_stack_fffffffffffffc70;
  edge_iterator in_stack_fffffffffffffc78;
  edges_range in_stack_fffffffffffffc80;
  iterator local_360;
  BBlocksContainerTy *local_358;
  BBlocksContainerTy **local_350;
  DGNode *local_348;
  iterator local_340;
  iterator local_338;
  NodesContainerTy *local_330;
  NodesContainerTy **local_328;
  allocator local_319;
  string local_318 [32];
  _Base_ptr local_2f8;
  undefined1 local_2f0;
  DGNodeCall *local_2e8;
  _Base_ptr local_2e0;
  undefined1 local_2d8;
  DGNode *local_2d0;
  DGNode **local_2c8;
  __normal_iterator<dg::sdg::DGNode_**,_std::vector<dg::sdg::DGNode_*,_std::allocator<dg::sdg::DGNode_*>_>_>
  local_2c0;
  NodesTy *local_2b8;
  DGBBlock *local_2b0;
  iterator local_2a8;
  iterator local_2a0;
  BBlocksContainerTy *local_298;
  BBlocksContainerTy **local_290;
  allocator local_281;
  string local_280 [32];
  DependenceGraph *local_260;
  iterator local_258;
  iterator local_250;
  SystemDependenceGraph *local_248;
  undefined1 local_240 [48];
  ostream local_210 [528];
  
  std::ofstream::ofstream(local_210,in_RSI,0x10);
  std::
  set<dg::sdg::DGNodeCall_*,_std::less<dg::sdg::DGNodeCall_*>,_std::allocator<dg::sdg::DGNodeCall_*>_>
  ::set((set<dg::sdg::DGNodeCall_*,_std::less<dg::sdg::DGNodeCall_*>,_std::allocator<dg::sdg::DGNodeCall_*>_>
         *)0x17ae7e);
  std::operator<<(local_210,"digraph SDG {\n");
  std::operator<<(local_210,"  compound=\"true\"\n");
  local_248 = SystemDependenceGraph::getSDG(*(SystemDependenceGraph **)in_RDI);
  local_250._M_current =
       (unique_ptr<dg::sdg::DependenceGraph,_std::default_delete<dg::sdg::DependenceGraph>_> *)
       sdg::SystemDependenceGraph::begin(in_stack_fffffffffffffb98);
  local_258._M_current =
       (unique_ptr<dg::sdg::DependenceGraph,_std::default_delete<dg::sdg::DependenceGraph>_> *)
       sdg::SystemDependenceGraph::end(in_stack_fffffffffffffb98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::unique_ptr<dg::sdg::DependenceGraph,_std::default_delete<dg::sdg::DependenceGraph>_>_*,_std::vector<std::unique_ptr<dg::sdg::DependenceGraph,_std::default_delete<dg::sdg::DependenceGraph>_>,_std::allocator<std::unique_ptr<dg::sdg::DependenceGraph,_std::default_delete<dg::sdg::DependenceGraph>_>_>_>_>
                        *)in_stack_fffffffffffffba0,
                       (__normal_iterator<std::unique_ptr<dg::sdg::DependenceGraph,_std::default_delete<dg::sdg::DependenceGraph>_>_*,_std::vector<std::unique_ptr<dg::sdg::DependenceGraph,_std::default_delete<dg::sdg::DependenceGraph>_>,_std::allocator<std::unique_ptr<dg::sdg::DependenceGraph,_std::default_delete<dg::sdg::DependenceGraph>_>_>_>_>
                        *)in_stack_fffffffffffffb98);
    if (!bVar1) break;
    local_260 = sdg::SystemDependenceGraph::graphs_iterator::operator*((graphs_iterator *)0x17af13);
    poVar8 = std::operator<<(local_210,"  subgraph cluster_dg_");
    uVar3 = sdg::DependenceGraph::getID(local_260);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar3);
    std::operator<<(poVar8," {\n");
    std::operator<<(local_210,"    color=black;\n");
    std::operator<<(local_210,"    style=filled;\n");
    std::operator<<(local_210,"    fillcolor=grey95;\n");
    in_stack_fffffffffffffc00 = std::operator<<(local_210,"    label=\"");
    psVar9 = sdg::DependenceGraph::getName_abi_cxx11_(local_260);
    poVar8 = std::operator<<(in_stack_fffffffffffffc00,(string *)psVar9);
    in_stack_fffffffffffffc08 = std::operator<<(poVar8," (id ");
    uVar3 = sdg::DependenceGraph::getID(local_260);
    poVar8 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffc08,uVar3);
    std::operator<<(poVar8,")\";\n");
    std::operator<<(local_210,"\n");
    in_stack_fffffffffffffc10 = (SDG2Dot *)sdg::DependenceGraph::getParameters(local_260);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_280,"formal parameters",&local_281);
    dumpParams((SDG2Dot *)in_stack_fffffffffffffc80._C,(ostream *)in_stack_fffffffffffffc78._M_node,
               (DGParameters *)in_stack_fffffffffffffc70._M_node,(string *)in_stack_fffffffffffffc68
              );
    std::__cxx11::string::~string(local_280);
    std::allocator<char>::~allocator((allocator<char> *)&local_281);
    local_298 = (BBlocksContainerTy *)
                sdg::DependenceGraph::getBBlocks((DependenceGraph *)in_stack_fffffffffffffb98);
    local_290 = &local_298;
    local_2a0._M_current =
         (unique_ptr<dg::sdg::DGBBlock,_std::default_delete<dg::sdg::DGBBlock>_> *)
         sdg::DependenceGraph::bblocks_range::begin((bblocks_range *)in_stack_fffffffffffffb98);
    local_2a8._M_current =
         (unique_ptr<dg::sdg::DGBBlock,_std::default_delete<dg::sdg::DGBBlock>_> *)
         sdg::DependenceGraph::bblocks_range::end((bblocks_range *)in_stack_fffffffffffffb98);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::unique_ptr<dg::sdg::DGBBlock,_std::default_delete<dg::sdg::DGBBlock>_>_*,_std::vector<std::unique_ptr<dg::sdg::DGBBlock,_std::default_delete<dg::sdg::DGBBlock>_>,_std::allocator<std::unique_ptr<dg::sdg::DGBBlock,_std::default_delete<dg::sdg::DGBBlock>_>_>_>_>
                          *)in_stack_fffffffffffffba0,
                         (__normal_iterator<std::unique_ptr<dg::sdg::DGBBlock,_std::default_delete<dg::sdg::DGBBlock>_>_*,_std::vector<std::unique_ptr<dg::sdg::DGBBlock,_std::default_delete<dg::sdg::DGBBlock>_>,_std::allocator<std::unique_ptr<dg::sdg::DGBBlock,_std::default_delete<dg::sdg::DGBBlock>_>_>_>_>
                          *)in_stack_fffffffffffffb98);
      if (!bVar1) break;
      local_2b0 = sdg::DependenceGraph::bblocks_iterator::operator*((bblocks_iterator *)0x17b10c);
      in_stack_fffffffffffffbe0 = (SDG2Dot *)std::operator<<(local_210,"    subgraph cluster_dg_");
      uVar3 = sdg::DependenceGraph::getID(local_260);
      poVar8 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffbe0,uVar3);
      poVar8 = std::operator<<(poVar8,"_bb_");
      uVar3 = sdg::DGElement::getID((DGElement *)local_2b0);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar3);
      std::operator<<(poVar8," {\n");
      poVar8 = std::operator<<(local_210,"      label=\"bblock #");
      uVar3 = sdg::DGElement::getID((DGElement *)local_2b0);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar3);
      std::operator<<(poVar8,"\"\n");
      local_2b8 = sdg::DGBBlock::getNodes(local_2b0);
      local_2c0._M_current =
           (DGNode **)
           std::vector<dg::sdg::DGNode_*,_std::allocator<dg::sdg::DGNode_*>_>::begin
                     ((vector<dg::sdg::DGNode_*,_std::allocator<dg::sdg::DGNode_*>_> *)
                      in_stack_fffffffffffffb98);
      local_2c8 = (DGNode **)
                  std::vector<dg::sdg::DGNode_*,_std::allocator<dg::sdg::DGNode_*>_>::end
                            ((vector<dg::sdg::DGNode_*,_std::allocator<dg::sdg::DGNode_*>_> *)
                             in_stack_fffffffffffffb98);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<dg::sdg::DGNode_**,_std::vector<dg::sdg::DGNode_*,_std::allocator<dg::sdg::DGNode_*>_>_>
                            *)in_stack_fffffffffffffba0,
                           (__normal_iterator<dg::sdg::DGNode_**,_std::vector<dg::sdg::DGNode_*,_std::allocator<dg::sdg::DGNode_*>_>_>
                            *)in_stack_fffffffffffffb98);
        if (!bVar1) break;
        ppDVar4 = __gnu_cxx::
                  __normal_iterator<dg::sdg::DGNode_**,_std::vector<dg::sdg::DGNode_*,_std::allocator<dg::sdg::DGNode_*>_>_>
                  ::operator*(&local_2c0);
        local_2d0 = *ppDVar4;
        pVar10 = std::
                 set<dg::sdg::DGNode_*,_std::less<dg::sdg::DGNode_*>,_std::allocator<dg::sdg::DGNode_*>_>
                 ::insert((set<dg::sdg::DGNode_*,_std::less<dg::sdg::DGNode_*>,_std::allocator<dg::sdg::DGNode_*>_>
                           *)in_stack_fffffffffffffbc0,(value_type *)in_stack_fffffffffffffbb8);
        local_2e0 = (_Base_ptr)pVar10.first._M_node;
        local_2d8 = pVar10.second;
        dumpNode(in_stack_fffffffffffffbe0,(ostream *)in_stack_fffffffffffffbd8,
                 (DGNode *)in_stack_fffffffffffffbd0,(Value *)in_stack_fffffffffffffbc8,
                 (char *)in_stack_fffffffffffffbc0);
        local_2e8 = sdg::DGNodeCall::get((DGElement *)in_stack_fffffffffffffba0);
        if (local_2e8 != (DGNodeCall *)0x0) {
          pVar11 = std::
                   set<dg::sdg::DGNodeCall_*,_std::less<dg::sdg::DGNodeCall_*>,_std::allocator<dg::sdg::DGNodeCall_*>_>
                   ::insert((set<dg::sdg::DGNodeCall_*,_std::less<dg::sdg::DGNodeCall_*>,_std::allocator<dg::sdg::DGNodeCall_*>_>
                             *)in_stack_fffffffffffffbc0,(value_type *)in_stack_fffffffffffffbb8);
          local_2f8 = (_Base_ptr)pVar11.first._M_node;
          local_2f0 = pVar11.second;
          in_stack_fffffffffffffbd8 = sdg::DGNodeCall::getParameters(local_2e8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_318,"actual parameters",&local_319);
          dumpParams((SDG2Dot *)in_stack_fffffffffffffc80._C,
                     (ostream *)in_stack_fffffffffffffc78._M_node,
                     (DGParameters *)in_stack_fffffffffffffc70._M_node,
                     (string *)in_stack_fffffffffffffc68);
          std::__cxx11::string::~string(local_318);
          std::allocator<char>::~allocator((allocator<char> *)&local_319);
        }
        __gnu_cxx::
        __normal_iterator<dg::sdg::DGNode_**,_std::vector<dg::sdg::DGNode_*,_std::allocator<dg::sdg::DGNode_*>_>_>
        ::operator++(&local_2c0);
      }
      std::operator<<(local_210,"    }\n");
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<dg::sdg::DGBBlock,_std::default_delete<dg::sdg::DGBBlock>_>_*,_std::vector<std::unique_ptr<dg::sdg::DGBBlock,_std::default_delete<dg::sdg::DGBBlock>_>,_std::allocator<std::unique_ptr<dg::sdg::DGBBlock,_std::default_delete<dg::sdg::DGBBlock>_>_>_>_>
      ::operator++(&local_2a0);
    }
    std::operator<<(local_210,"    /* edges */\n");
    local_330 = (NodesContainerTy *)
                sdg::DependenceGraph::getNodes((DependenceGraph *)in_stack_fffffffffffffb98);
    local_328 = &local_330;
    local_338._M_current =
         (unique_ptr<dg::sdg::DGNode,_std::default_delete<dg::sdg::DGNode>_> *)
         sdg::DependenceGraph::nodes_range::begin((nodes_range *)in_stack_fffffffffffffb98);
    local_340._M_current =
         (unique_ptr<dg::sdg::DGNode,_std::default_delete<dg::sdg::DGNode>_> *)
         sdg::DependenceGraph::nodes_range::end((nodes_range *)in_stack_fffffffffffffb98);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::unique_ptr<dg::sdg::DGNode,_std::default_delete<dg::sdg::DGNode>_>_*,_std::vector<std::unique_ptr<dg::sdg::DGNode,_std::default_delete<dg::sdg::DGNode>_>,_std::allocator<std::unique_ptr<dg::sdg::DGNode,_std::default_delete<dg::sdg::DGNode>_>_>_>_>
                          *)in_stack_fffffffffffffba0,
                         (__normal_iterator<std::unique_ptr<dg::sdg::DGNode,_std::default_delete<dg::sdg::DGNode>_>_*,_std::vector<std::unique_ptr<dg::sdg::DGNode,_std::default_delete<dg::sdg::DGNode>_>,_std::allocator<std::unique_ptr<dg::sdg::DGNode,_std::default_delete<dg::sdg::DGNode>_>_>_>_>
                          *)in_stack_fffffffffffffb98);
      if (!bVar1) break;
      local_348 = sdg::DependenceGraph::nodes_iterator::operator*((nodes_iterator *)0x17b409);
      dumpEdges(in_stack_fffffffffffffc20,in_RDI,(DGNode *)in_stack_fffffffffffffc10);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<dg::sdg::DGNode,_std::default_delete<dg::sdg::DGNode>_>_*,_std::vector<std::unique_ptr<dg::sdg::DGNode,_std::default_delete<dg::sdg::DGNode>_>,_std::allocator<std::unique_ptr<dg::sdg::DGNode,_std::default_delete<dg::sdg::DGNode>_>_>_>_>
      ::operator++(&local_338);
    }
    std::operator<<(local_210,"    /* block edges */\n");
    local_358 = (BBlocksContainerTy *)
                sdg::DependenceGraph::getBBlocks((DependenceGraph *)in_stack_fffffffffffffb98);
    local_350 = &local_358;
    local_360._M_current =
         (unique_ptr<dg::sdg::DGBBlock,_std::default_delete<dg::sdg::DGBBlock>_> *)
         sdg::DependenceGraph::bblocks_range::begin((bblocks_range *)in_stack_fffffffffffffb98);
    sdg::DependenceGraph::bblocks_range::end((bblocks_range *)in_stack_fffffffffffffb98);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::unique_ptr<dg::sdg::DGBBlock,_std::default_delete<dg::sdg::DGBBlock>_>_*,_std::vector<std::unique_ptr<dg::sdg::DGBBlock,_std::default_delete<dg::sdg::DGBBlock>_>,_std::allocator<std::unique_ptr<dg::sdg::DGBBlock,_std::default_delete<dg::sdg::DGBBlock>_>_>_>_>
                          *)in_stack_fffffffffffffba0,
                         (__normal_iterator<std::unique_ptr<dg::sdg::DGBBlock,_std::default_delete<dg::sdg::DGBBlock>_>_*,_std::vector<std::unique_ptr<dg::sdg::DGBBlock,_std::default_delete<dg::sdg::DGBBlock>_>,_std::allocator<std::unique_ptr<dg::sdg::DGBBlock,_std::default_delete<dg::sdg::DGBBlock>_>_>_>_>
                          *)in_stack_fffffffffffffb98);
      if (!bVar1) break;
      this_00 = sdg::DependenceGraph::bblocks_iterator::operator*((bblocks_iterator *)0x17b4cb);
      in_stack_fffffffffffffc80 =
           sdg::DepDGElement::controls((DepDGElement *)in_stack_fffffffffffffb98);
      in_stack_fffffffffffffc78 =
           sdg::DepDGElement::edges_range::begin((edges_range *)in_stack_fffffffffffffb98);
      in_stack_fffffffffffffc70 =
           sdg::DepDGElement::edges_range::end((edges_range *)in_stack_fffffffffffffb98);
      while( true ) {
        bVar1 = std::operator!=((_Self *)&stack0xfffffffffffffc78,(_Self *)&stack0xfffffffffffffc70)
        ;
        if (!bVar1) break;
        ppDVar5 = std::_Rb_tree_const_iterator<dg::sdg::DepDGElement_*>::operator*
                            ((_Rb_tree_const_iterator<dg::sdg::DepDGElement_*> *)0x17b54d);
        in_stack_fffffffffffffc68 = *ppDVar5;
        in_stack_fffffffffffffbd0 = std::operator<<(local_210,"    ");
        sdg::DGBBlock::back((DGBBlock *)0x17b57e);
        poVar8 = operator<<(in_stack_fffffffffffffbb0,(DGElement *)in_stack_fffffffffffffba8);
        std::operator<<(poVar8," -> ");
        local_3a0 = sdg::DGBBlock::get((DGElement *)in_stack_fffffffffffffba0);
        if (local_3a0 == (DGBBlock *)0x0) {
          operator<<(in_stack_fffffffffffffbb0,(DGElement *)in_stack_fffffffffffffba8);
        }
        else {
          sdg::DGBBlock::front((DGBBlock *)0x17b5c7);
          operator<<(in_stack_fffffffffffffbb0,(DGElement *)in_stack_fffffffffffffba8);
        }
        poVar8 = std::operator<<(local_210,"[color=blue penwidth=2 ");
        in_stack_fffffffffffffbc0 = std::operator<<(poVar8," ltail=cluster_dg_");
        uVar3 = sdg::DependenceGraph::getID(local_260);
        poVar8 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffbc0,uVar3);
        in_stack_fffffffffffffbc8 = std::operator<<(poVar8,"_bb_");
        uVar3 = sdg::DGElement::getID((DGElement *)this_00);
        std::ostream::operator<<(in_stack_fffffffffffffbc8,uVar3);
        DVar2 = sdg::DGElement::getType((DGElement *)in_stack_fffffffffffffc68);
        if (DVar2 == BBLOCK) {
          in_stack_fffffffffffffbb0 = std::operator<<(local_210," lhead=cluster_dg_");
          uVar3 = sdg::DependenceGraph::getID(local_260);
          poVar8 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffbb0,uVar3);
          in_stack_fffffffffffffbb8 = std::operator<<(poVar8,"_bb_");
          uVar3 = sdg::DGElement::getID((DGElement *)in_stack_fffffffffffffc68);
          std::ostream::operator<<(in_stack_fffffffffffffbb8,uVar3);
        }
        std::operator<<(local_210,"]\n");
        std::_Rb_tree_const_iterator<dg::sdg::DepDGElement_*>::operator++
                  ((_Rb_tree_const_iterator<dg::sdg::DepDGElement_*> *)in_stack_fffffffffffffba0);
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<dg::sdg::DGBBlock,_std::default_delete<dg::sdg::DGBBlock>_>_*,_std::vector<std::unique_ptr<dg::sdg::DGBBlock,_std::default_delete<dg::sdg::DGBBlock>_>,_std::allocator<std::unique_ptr<dg::sdg::DGBBlock,_std::default_delete<dg::sdg::DGBBlock>_>_>_>_>
      ::operator++(&local_360);
    }
    std::operator<<(local_210,"  }\n");
    sdg::DependenceGraph::getParameters(local_260);
    dumpParamEdges(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                   (DGParameters *)in_stack_fffffffffffffc00);
    std::set<dg::sdg::DGNode_*,_std::less<dg::sdg::DGNode_*>,_std::allocator<dg::sdg::DGNode_*>_>::
    clear((set<dg::sdg::DGNode_*,_std::less<dg::sdg::DGNode_*>,_std::allocator<dg::sdg::DGNode_*>_>
           *)0x17b751);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<dg::sdg::DependenceGraph,_std::default_delete<dg::sdg::DependenceGraph>_>_*,_std::vector<std::unique_ptr<dg::sdg::DependenceGraph,_std::default_delete<dg::sdg::DependenceGraph>_>,_std::allocator<std::unique_ptr<dg::sdg::DependenceGraph,_std::default_delete<dg::sdg::DependenceGraph>_>_>_>_>
    ::operator++(&local_250);
  }
  bVar1 = std::
          set<dg::sdg::DGNodeCall_*,_std::less<dg::sdg::DGNodeCall_*>,_std::allocator<dg::sdg::DGNodeCall_*>_>
          ::empty((set<dg::sdg::DGNodeCall_*,_std::less<dg::sdg::DGNodeCall_*>,_std::allocator<dg::sdg::DGNodeCall_*>_>
                   *)0x17b770);
  if (!bVar1) {
    std::operator<<(local_210," /* call and param edges */\n");
  }
  local_3a8 = local_240;
  local_3b0._M_node =
       (_Base_ptr)
       std::
       set<dg::sdg::DGNodeCall_*,_std::less<dg::sdg::DGNodeCall_*>,_std::allocator<dg::sdg::DGNodeCall_*>_>
       ::begin((set<dg::sdg::DGNodeCall_*,_std::less<dg::sdg::DGNodeCall_*>,_std::allocator<dg::sdg::DGNodeCall_*>_>
                *)in_stack_fffffffffffffb98);
  local_3b8._M_node =
       (_Base_ptr)
       std::
       set<dg::sdg::DGNodeCall_*,_std::less<dg::sdg::DGNodeCall_*>,_std::allocator<dg::sdg::DGNodeCall_*>_>
       ::end((set<dg::sdg::DGNodeCall_*,_std::less<dg::sdg::DGNodeCall_*>,_std::allocator<dg::sdg::DGNodeCall_*>_>
              *)in_stack_fffffffffffffb98);
  while( true ) {
    bVar1 = std::operator!=(&local_3b0,&local_3b8);
    if (!bVar1) break;
    ppDVar6 = std::_Rb_tree_const_iterator<dg::sdg::DGNodeCall_*>::operator*
                        ((_Rb_tree_const_iterator<dg::sdg::DGNodeCall_*> *)0x17b7ed);
    local_3c0 = *ppDVar6;
    sdg::DGNodeCall::getParameters(local_3c0);
    bindParamsToCall(in_stack_fffffffffffffbe0,(ostream *)in_stack_fffffffffffffbd8,
                     (DGParameters *)in_stack_fffffffffffffbd0,(DGNode *)in_stack_fffffffffffffbc8);
    sdg::DGNodeCall::getParameters(local_3c0);
    dumpParamEdges(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                   (DGParameters *)in_stack_fffffffffffffc00);
    local_3c8 = sdg::DGNodeCall::getCallees(local_3c0);
    local_3d0._M_node =
         (_Base_ptr)
         std::
         set<dg::sdg::DependenceGraph_*,_std::less<dg::sdg::DependenceGraph_*>,_std::allocator<dg::sdg::DependenceGraph_*>_>
         ::begin((set<dg::sdg::DependenceGraph_*,_std::less<dg::sdg::DependenceGraph_*>,_std::allocator<dg::sdg::DependenceGraph_*>_>
                  *)in_stack_fffffffffffffb98);
    local_3d8._M_node =
         (_Base_ptr)
         std::
         set<dg::sdg::DependenceGraph_*,_std::less<dg::sdg::DependenceGraph_*>,_std::allocator<dg::sdg::DependenceGraph_*>_>
         ::end((set<dg::sdg::DependenceGraph_*,_std::less<dg::sdg::DependenceGraph_*>,_std::allocator<dg::sdg::DependenceGraph_*>_>
                *)in_stack_fffffffffffffb98);
    while( true ) {
      bVar1 = std::operator!=(&local_3d0,&local_3d8);
      if (!bVar1) break;
      ppDVar7 = std::_Rb_tree_const_iterator<dg::sdg::DependenceGraph_*>::operator*
                          ((_Rb_tree_const_iterator<dg::sdg::DependenceGraph_*> *)0x17b8b4);
      this_01 = *ppDVar7;
      std::operator<<(local_210,"  ");
      poVar8 = operator<<(in_stack_fffffffffffffbb0,(DGElement *)in_stack_fffffffffffffba8);
      in_stack_fffffffffffffb98 = (SystemDependenceGraph *)std::operator<<(poVar8," -> ");
      sdg::DependenceGraph::getFirstNode((DependenceGraph *)in_stack_fffffffffffffbb0);
      poVar8 = operator<<(in_stack_fffffffffffffbb0,(DGElement *)in_stack_fffffffffffffba8);
      in_stack_fffffffffffffba0 = std::operator<<(poVar8,"[lhead=cluster_dg_");
      uVar3 = sdg::DependenceGraph::getID(this_01);
      poVar8 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffba0,uVar3);
      in_stack_fffffffffffffba8 = std::operator<<(poVar8," label=\"call \'");
      psVar9 = sdg::DependenceGraph::getName_abi_cxx11_(this_01);
      poVar8 = std::operator<<(in_stack_fffffffffffffba8,(string *)psVar9);
      poVar8 = std::operator<<(poVar8,"\'\"");
      std::operator<<(poVar8," style=dashed penwidth=3]\n");
      std::_Rb_tree_const_iterator<dg::sdg::DependenceGraph_*>::operator++
                ((_Rb_tree_const_iterator<dg::sdg::DependenceGraph_*> *)in_stack_fffffffffffffba0);
    }
    std::_Rb_tree_const_iterator<dg::sdg::DGNodeCall_*>::operator++
              ((_Rb_tree_const_iterator<dg::sdg::DGNodeCall_*> *)in_stack_fffffffffffffba0);
  }
  std::operator<<(local_210,"}\n");
  std::
  set<dg::sdg::DGNodeCall_*,_std::less<dg::sdg::DGNodeCall_*>,_std::allocator<dg::sdg::DGNodeCall_*>_>
  ::~set((set<dg::sdg::DGNodeCall_*,_std::less<dg::sdg::DGNodeCall_*>,_std::allocator<dg::sdg::DGNodeCall_*>_>
          *)0x17b9cf);
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void dump(const std::string &file) const {
        std::ofstream out(file);
        std::set<sdg::DGNodeCall *> calls;

        out << "digraph SDG {\n";
        out << "  compound=\"true\"\n";

        for (auto *dg : _llvmsdg->getSDG()) {
            ///
            // Dependence graphs (functions)
            out << "  subgraph cluster_dg_" << dg->getID() << " {\n";
            out << "    color=black;\n";
            out << "    style=filled;\n";
            out << "    fillcolor=grey95;\n";
            out << "    label=\"" << dg->getName() << " (id " << dg->getID()
                << ")\";\n";
            out << "\n";

            ///
            // Parameters of the DG
            //
            /// Formal input parameters
            dumpParams(out, dg->getParameters(), "formal parameters");

            ///
            // Basic blocks
            for (auto *blk : dg->getBBlocks()) {
                out << "    subgraph cluster_dg_" << dg->getID() << "_bb_"
                    << blk->getID() << " {\n";
                out << "      label=\"bblock #" << blk->getID() << "\"\n";
                for (auto *nd : blk->getNodes()) {
                    dumpedNodes.insert(nd);
                    dumpNode(out, *nd);

                    if (auto *C = sdg::DGNodeCall::get(nd)) {
                        // store the node for later use (dumping of call edges
                        // etc.)
                        calls.insert(C);
                        // dump actual parameters
                        dumpParams(out, C->getParameters(),
                                   "actual parameters");
                    }
                }
                out << "    }\n";
            }

            ///
            // -- edges --
            out << "    /* edges */\n";
            for (auto *nd : dg->getNodes()) {
                dumpEdges(out, *nd);
            }
            out << "    /* block edges */\n";
            for (auto *blk : dg->getBBlocks()) {
                for (auto *ctrl : blk->controls()) {
                    out << "    " << *blk->back() << " -> ";
                    if (auto *ctrlB = sdg::DGBBlock::get(ctrl)) {
                        out << *ctrlB->front();
                    } else {
                        out << *ctrl;
                    }

                    out << "[color=blue penwidth=2 "
                        << " ltail=cluster_dg_" << dg->getID() << "_bb_"
                        << blk->getID();

                    if (ctrl->getType() == sdg::DGElementType::BBLOCK) {
                        out << " lhead=cluster_dg_" << dg->getID() << "_bb_"
                            << ctrl->getID();
                    }
                    out << "]\n";
                }
            }

            out << "  }\n";

            // formal parameters edges
            dumpParamEdges(out, dg->getParameters());

            dumpedNodes.clear();
        }

        ////
        // -- Interprocedural edges and parameter edges--

        if (!calls.empty()) {
            out << " /* call and param edges */\n";
        }
        for (auto *C : calls) {
            bindParamsToCall(out, C->getParameters(), C);
            dumpParamEdges(out, C->getParameters());
            for (auto *dg : C->getCallees()) {
                out << "  " << *C << " -> " << *dg->getFirstNode()
                    << "[lhead=cluster_dg_" << dg->getID() << " label=\"call '"
                    << dg->getName() << "'\""
                    << " style=dashed penwidth=3]\n";
            }
        }

        out << "}\n";
    }